

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void writeBlockHeader(void *op,size_t cSize,size_t blockSize,U32 lastBlock)

{
  undefined4 local_2c;
  U32 cBlockHeader;
  U32 lastBlock_local;
  size_t blockSize_local;
  size_t cSize_local;
  void *op_local;
  
  if (cSize == 1) {
    local_2c = lastBlock + 2 + (int)(blockSize << 3);
  }
  else {
    local_2c = lastBlock + 4 + (int)(cSize << 3);
  }
  MEM_writeLE24(op,local_2c);
  return;
}

Assistant:

static void writeBlockHeader(void* op, size_t cSize, size_t blockSize, U32 lastBlock) {
    U32 const cBlockHeader = cSize == 1 ?
                        lastBlock + (((U32)bt_rle)<<1) + (U32)(blockSize << 3) :
                        lastBlock + (((U32)bt_compressed)<<1) + (U32)(cSize << 3);
    MEM_writeLE24(op, cBlockHeader);
    DEBUGLOG(3, "writeBlockHeader: cSize: %zu blockSize: %zu lastBlock: %u", cSize, blockSize, lastBlock);
}